

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O0

AffixTag __thiscall
icu_63::number::impl::AffixUtils::nextToken
          (AffixUtils *this,AffixTag tag,UnicodeString *patternString,UErrorCode *status)

{
  int32_t iVar1;
  uint cp_00;
  int iVar2;
  AffixTag AVar3;
  int32_t count;
  UChar32 cp;
  int32_t state;
  int32_t offset;
  UErrorCode *status_local;
  UnicodeString *patternString_local;
  AffixTag tag_local;
  
  patternString_local._0_4_ = (UChar32)this;
  cp = (UChar32)patternString_local;
  tag_local.offset = tag.offset;
  count = tag_local.offset;
  tag_local._0_8_ = tag._0_8_;
  do {
    iVar1 = UnicodeString::length(tag._8_8_);
    if (iVar1 <= cp) {
      switch(count) {
      case 0:
        AffixTag::AffixTag((AffixTag *)&tag_local.state,-1);
        return stack0xffffffffffffffe8;
      case 1:
      case 2:
        *(undefined4 *)&(patternString->super_Replaceable).super_UObject._vptr_UObject = 1;
        AffixTag::AffixTag((AffixTag *)&tag_local.state,-1);
        return stack0xffffffffffffffe8;
      case 3:
        AffixTag::AffixTag((AffixTag *)&tag_local.state,-1);
        return stack0xffffffffffffffe8;
      case 4:
        AVar3 = makeTag(cp,TYPE_CURRENCY_SINGLE,STATE_BASE,0);
        return AVar3;
      case 5:
        AVar3 = makeTag(cp,TYPE_CURRENCY_DOUBLE,STATE_BASE,0);
        return AVar3;
      case 6:
        AVar3 = makeTag(cp,TYPE_CURRENCY_TRIPLE,STATE_BASE,0);
        return AVar3;
      case 7:
        AVar3 = makeTag(cp,TYPE_CURRENCY_QUAD,STATE_BASE,0);
        return AVar3;
      case 8:
        AVar3 = makeTag(cp,TYPE_CURRENCY_QUINT,STATE_BASE,0);
        return AVar3;
      case 9:
        AVar3 = makeTag(cp,TYPE_CURRENCY_OVERFLOW,STATE_BASE,0);
        return AVar3;
      default:
        AffixTag::AffixTag((AffixTag *)&tag_local.state,-1);
        return stack0xffffffffffffffe8;
      }
    }
    cp_00 = UnicodeString::char32At(tag._8_8_,cp);
    iVar2 = 2 - (uint)(cp_00 < 0x10000);
    switch(count) {
    case 0:
      if (cp_00 == 0x25) {
        AVar3 = makeTag(cp + iVar2,TYPE_PERCENT,STATE_BASE,0);
        return AVar3;
      }
      if (cp_00 == 0x27) {
        count = 1;
      }
      else {
        if (cp_00 == 0x2b) {
          AVar3 = makeTag(cp + iVar2,TYPE_PLUS_SIGN,STATE_BASE,0);
          return AVar3;
        }
        if (cp_00 == 0x2d) {
          AVar3 = makeTag(cp + iVar2,TYPE_MINUS_SIGN,STATE_BASE,0);
          return AVar3;
        }
        if (cp_00 != 0xa4) {
          if (cp_00 != 0x2030) {
            AVar3 = makeTag(cp + iVar2,TYPE_CODEPOINT,STATE_BASE,cp_00);
            return AVar3;
          }
          AVar3 = makeTag(cp + iVar2,TYPE_PERMILLE,STATE_BASE,0);
          return AVar3;
        }
        count = 4;
      }
      cp = iVar2 + cp;
      break;
    case 1:
      if (cp_00 == 0x27) {
        join_0x00000010_0x00000000_ = makeTag(cp + iVar2,TYPE_CODEPOINT,STATE_BASE,0x27);
      }
      else {
        join_0x00000010_0x00000000_ = makeTag(cp + iVar2,TYPE_CODEPOINT,STATE_INSIDE_QUOTE,cp_00);
      }
      return stack0xffffffffffffffe8;
    case 2:
      if (cp_00 != 0x27) {
        AVar3 = makeTag(cp + iVar2,TYPE_CODEPOINT,STATE_INSIDE_QUOTE,cp_00);
        return AVar3;
      }
      count = 3;
      cp = iVar2 + cp;
      break;
    case 3:
      if (cp_00 == 0x27) {
        AVar3 = makeTag(cp + iVar2,TYPE_CODEPOINT,STATE_INSIDE_QUOTE,0x27);
        return AVar3;
      }
      count = 0;
      break;
    case 4:
      if (cp_00 != 0xa4) {
        AVar3 = makeTag(cp,TYPE_CURRENCY_SINGLE,STATE_BASE,0);
        return AVar3;
      }
      count = 5;
      cp = iVar2 + cp;
      break;
    case 5:
      if (cp_00 != 0xa4) {
        AVar3 = makeTag(cp,TYPE_CURRENCY_DOUBLE,STATE_BASE,0);
        return AVar3;
      }
      count = 6;
      cp = iVar2 + cp;
      break;
    case 6:
      if (cp_00 != 0xa4) {
        AVar3 = makeTag(cp,TYPE_CURRENCY_TRIPLE,STATE_BASE,0);
        return AVar3;
      }
      count = 7;
      cp = iVar2 + cp;
      break;
    case 7:
      if (cp_00 != 0xa4) {
        AVar3 = makeTag(cp,TYPE_CURRENCY_QUAD,STATE_BASE,0);
        return AVar3;
      }
      count = 8;
      cp = iVar2 + cp;
      break;
    case 8:
      if (cp_00 != 0xa4) {
        AVar3 = makeTag(cp,TYPE_CURRENCY_QUINT,STATE_BASE,0);
        return AVar3;
      }
      count = 9;
      cp = iVar2 + cp;
      break;
    case 9:
      if (cp_00 != 0xa4) {
        AVar3 = makeTag(cp,TYPE_CURRENCY_OVERFLOW,STATE_BASE,0);
        return AVar3;
      }
      cp = iVar2 + cp;
    }
  } while( true );
}

Assistant:

AffixTag AffixUtils::nextToken(AffixTag tag, const UnicodeString &patternString, UErrorCode &status) {
    int32_t offset = tag.offset;
    int32_t state = tag.state;
    for (; offset < patternString.length();) {
        UChar32 cp = patternString.char32At(offset);
        int32_t count = U16_LENGTH(cp);

        switch (state) {
            case STATE_BASE:
                switch (cp) {
                    case u'\'':
                        state = STATE_FIRST_QUOTE;
                        offset += count;
                        // continue to the next code point
                        break;
                    case u'-':
                        return makeTag(offset + count, TYPE_MINUS_SIGN, STATE_BASE, 0);
                    case u'+':
                        return makeTag(offset + count, TYPE_PLUS_SIGN, STATE_BASE, 0);
                    case u'%':
                        return makeTag(offset + count, TYPE_PERCENT, STATE_BASE, 0);
                    case u'‰':
                        return makeTag(offset + count, TYPE_PERMILLE, STATE_BASE, 0);
                    case u'¤':
                        state = STATE_FIRST_CURR;
                        offset += count;
                        // continue to the next code point
                        break;
                    default:
                        return makeTag(offset + count, TYPE_CODEPOINT, STATE_BASE, cp);
                }
                break;
            case STATE_FIRST_QUOTE:
                if (cp == u'\'') {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_BASE, cp);
                } else {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                }
            case STATE_INSIDE_QUOTE:
                if (cp == u'\'') {
                    state = STATE_AFTER_QUOTE;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                }
            case STATE_AFTER_QUOTE:
                if (cp == u'\'') {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                } else {
                    state = STATE_BASE;
                    // re-evaluate this code point
                    break;
                }
            case STATE_FIRST_CURR:
                if (cp == u'¤') {
                    state = STATE_SECOND_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_SINGLE, STATE_BASE, 0);
                }
            case STATE_SECOND_CURR:
                if (cp == u'¤') {
                    state = STATE_THIRD_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_DOUBLE, STATE_BASE, 0);
                }
            case STATE_THIRD_CURR:
                if (cp == u'¤') {
                    state = STATE_FOURTH_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_TRIPLE, STATE_BASE, 0);
                }
            case STATE_FOURTH_CURR:
                if (cp == u'¤') {
                    state = STATE_FIFTH_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_QUAD, STATE_BASE, 0);
                }
            case STATE_FIFTH_CURR:
                if (cp == u'¤') {
                    state = STATE_OVERFLOW_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_QUINT, STATE_BASE, 0);
                }
            case STATE_OVERFLOW_CURR:
                if (cp == u'¤') {
                    offset += count;
                    // continue to the next code point and loop back to this state
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_OVERFLOW, STATE_BASE, 0);
                }
            default:
                U_ASSERT(false);
        }
    }
    // End of string
    switch (state) {
        case STATE_BASE:
            // No more tokens in string.
            return {-1};
        case STATE_FIRST_QUOTE:
        case STATE_INSIDE_QUOTE:
            // For consistent behavior with the JDK and ICU 58, set an error here.
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return {-1};
        case STATE_AFTER_QUOTE:
            // No more tokens in string.
            return {-1};
        case STATE_FIRST_CURR:
            return makeTag(offset, TYPE_CURRENCY_SINGLE, STATE_BASE, 0);
        case STATE_SECOND_CURR:
            return makeTag(offset, TYPE_CURRENCY_DOUBLE, STATE_BASE, 0);
        case STATE_THIRD_CURR:
            return makeTag(offset, TYPE_CURRENCY_TRIPLE, STATE_BASE, 0);
        case STATE_FOURTH_CURR:
            return makeTag(offset, TYPE_CURRENCY_QUAD, STATE_BASE, 0);
        case STATE_FIFTH_CURR:
            return makeTag(offset, TYPE_CURRENCY_QUINT, STATE_BASE, 0);
        case STATE_OVERFLOW_CURR:
            return makeTag(offset, TYPE_CURRENCY_OVERFLOW, STATE_BASE, 0);
        default:
            U_ASSERT(false);
            return {-1}; // suppress "control reaches end of non-void function"
    }
}